

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall HighsSparseMatrix::scaleRow(HighsSparseMatrix *this,HighsInt row,double rowScale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  
  if (this->format_ == kColwise) {
    iVar1 = this->num_col_;
    if (0 < (long)iVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        iVar2 = piVar4[lVar7];
        lVar8 = (long)iVar2;
        iVar3 = piVar4[lVar7 + 1];
        if (iVar2 < iVar3) {
          pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            if (piVar5[lVar8] == row) {
              pdVar6[lVar8] = pdVar6[lVar8] * rowScale;
            }
            lVar8 = lVar8 + 1;
          } while (iVar3 != lVar8);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar1);
    }
  }
  else {
    piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[row];
    lVar7 = (long)iVar1;
    iVar2 = piVar4[(long)row + 1];
    if (iVar1 < iVar2) {
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pdVar6[lVar7] = pdVar6[lVar7] * rowScale;
        lVar7 = lVar7 + 1;
      } while (iVar2 != lVar7);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}